

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O2

uint64_t absl::lts_20240722::str_format_internal::FormatConversionCharToConvInt(char conv)

{
  undefined7 in_register_00000039;
  uint64_t uStack_8;
  
  switch((int)CONCAT71(in_register_00000039,conv)) {
  case 0x58:
    return 0x100;
  case 0x61:
    return 0x8000;
  case 99:
    uStack_8 = 2;
    break;
  case 100:
    uStack_8 = 8;
    break;
  case 0x65:
    return 0x800;
  case 0x66:
    return 0x200;
  case 0x67:
    return 0x2000;
  case 0x69:
    uStack_8 = 0x10;
    break;
  case 0x6e:
    return 0x20000;
  case 0x6f:
    uStack_8 = 0x20;
    break;
  case 0x70:
    return 0x40000;
  case 0x73:
    uStack_8 = 4;
    break;
  case 0x75:
    uStack_8 = 0x40;
    break;
  case 0x76:
    return 0x80000;
  case 0x78:
    return 0x80;
  default:
    switch((int)CONCAT71(in_register_00000039,conv)) {
    case 0x41:
      return 0x10000;
    case 0x45:
      return 0x1000;
    case 0x46:
      return 0x400;
    case 0x47:
      return 0x4000;
    }
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x62:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x77:
    return (ulong)(conv == '*');
  }
  return uStack_8;
}

Assistant:

constexpr uint64_t FormatConversionCharToConvInt(char conv) {
  return
#define ABSL_INTERNAL_CHAR_SET_CASE(c)                                 \
  conv == #c[0]                                                        \
      ? FormatConversionCharToConvInt(FormatConversionCharInternal::c) \
      :
      ABSL_INTERNAL_CONVERSION_CHARS_EXPAND_(ABSL_INTERNAL_CHAR_SET_CASE, )
#undef ABSL_INTERNAL_CHAR_SET_CASE
                  conv == '*'
          ? 1
          : 0;
}